

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load-balance-sampling.hpp
# Opt level: O0

void diy::detail::recv_block(AuxBlock *param_1,ProxyWithLink *cp,Master *master)

{
  Proxy *this;
  Proxy *pPVar1;
  MemoryBuffer *__args;
  size_t sVar2;
  Link *recv_link;
  MemoryBuffer bb;
  void *recv_b;
  int move_gid;
  int gid;
  int i;
  vector<int,_std::allocator<int>_> incoming_gids;
  Master *in_stack_fffffffffffffef8;
  Proxy *in_stack_ffffffffffffff00;
  int from;
  vector<int,_std::allocator<int>_> *v;
  Proxy *in_stack_ffffffffffffff20;
  Link *in_stack_ffffffffffffff58;
  BinaryBuffer *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  Master *in_stack_ffffffffffffff70;
  int local_40;
  vector<int,_std::allocator<int>_> local_30 [2];
  
  v = local_30;
  Catch::clara::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)0x272661);
  Master::Proxy::incoming(in_stack_ffffffffffffff20,v);
  local_40 = 0;
  while( true ) {
    this = (Proxy *)(long)local_40;
    pPVar1 = (Proxy *)Catch::clara::std::vector<int,_std::allocator<int>_>::size(local_30);
    if (pPVar1 <= this) break;
    Catch::clara::std::vector<int,_std::allocator<int>_>::operator[](local_30,(long)local_40);
    __args = Master::Proxy::incoming
                       (in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    sVar2 = MemoryBuffer::size((MemoryBuffer *)0x2726ee);
    if (sVar2 != 0) {
      Master::Proxy::dequeue<int>
                (this,(int)((ulong)__args >> 0x20),&in_stack_ffffffffffffff00->gid_,
                 (_func_void_BinaryBuffer_ptr_int_ptr *)in_stack_fffffffffffffef8);
      Master::creator(in_stack_fffffffffffffef8);
      in_stack_ffffffffffffff00 =
           (Proxy *)Catch::clara::std::function<void_*()>::operator()
                              ((function<void_*()> *)in_stack_ffffffffffffff00);
      Catch::clara::std::function<void_*()>::~function((function<void_*()> *)0x272755);
      MemoryBuffer::MemoryBuffer
                ((MemoryBuffer *)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8);
      Master::Proxy::dequeue<std::vector<char,std::allocator<char>>>
                (this,(int)((ulong)__args >> 0x20),
                 (vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff00,
                 (_func_void_BinaryBuffer_ptr_vector<char,_std::allocator<char>_>_ptr *)
                 in_stack_fffffffffffffef8);
      Master::loader(in_stack_fffffffffffffef8);
      Catch::clara::std::function<void_(void_*,_diy::BinaryBuffer_&)>::operator()
                ((function<void_(void_*,_diy::BinaryBuffer_&)> *)this,__args,
                 (BinaryBuffer *)in_stack_ffffffffffffff00);
      from = (int)((ulong)__args >> 0x20);
      Catch::clara::std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
                ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x2727cb);
      Master::Proxy::dequeue<std::vector<char,std::allocator<char>>>
                (this,from,(vector<char,_std::allocator<char>_> *)in_stack_ffffffffffffff00,
                 (_func_void_BinaryBuffer_ptr_vector<char,_std::allocator<char>_>_ptr *)
                 in_stack_fffffffffffffef8);
      in_stack_fffffffffffffef8 = (Master *)LinkFactory::load(in_stack_ffffffffffffff60);
      Master::add(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
                  in_stack_ffffffffffffff58);
      MemoryBuffer::~MemoryBuffer((MemoryBuffer *)in_stack_ffffffffffffff00);
    }
    local_40 = local_40 + 1;
  }
  Catch::clara::std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)this);
  return;
}

Assistant:

inline void recv_block(AuxBlock*,                                      // local block (unused)
                const diy::Master::ProxyWithLink&   cp,         // communication proxy for neighbor blocks
                diy::Master&                        master)     // real master with multiple blocks per process
{
    std::vector<int> incoming_gids;
    cp.incoming(incoming_gids);

    // for anything incoming, dequeue data received in the last exchange
    for (int i = 0; i < incoming_gids.size(); i++)
    {
        int gid = incoming_gids[i];
        if (cp.incoming(gid).size())
        {
            // dequeue the gid of the moving block
            int move_gid;
            cp.dequeue(gid, move_gid);

            // dequeue the block
            void* recv_b = master.creator()();
            diy::MemoryBuffer bb;
            cp.dequeue(gid, bb.buffer);
            master.loader()(recv_b, bb);

            // dequeue the link
            diy::Link* recv_link;
            cp.dequeue(gid, bb.buffer);
            recv_link = diy::LinkFactory::load(bb);

            // add block to the master
            master.add(move_gid, recv_b, recv_link);
        }
    }
}